

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
HdlcSimulationDataGenerator::TransmitBitSync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  uint *puVar1;
  pointer puVar2;
  bool bVar3;
  BitState bitState;
  pointer puVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  char cVar10;
  BitState BVar11;
  bool bVar12;
  BitExtractor bit_extractor;
  BitExtractor local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ulong local_38;
  
  CreateFlagBitSeq(this);
  puVar2 = (this->mAbortFramesIndexes).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->mAbortFramesIndexes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar2;
  bVar12 = lVar5 != 0;
  if ((bVar12) && (*puVar2 != this->mFrameNumber)) {
    uVar6 = lVar5 >> 2;
    uVar8 = 1;
    do {
      bVar12 = uVar8 < uVar6;
      if (uVar6 <= uVar8) break;
      puVar1 = puVar2 + uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (*puVar1 != this->mFrameNumber);
  }
  puVar4 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar4) {
    uVar9 = (int)this + 0x48;
    cVar10 = '\0';
    BVar11 = BIT_LOW;
    uVar8 = 0;
    local_40 = stream;
    do {
      bVar3 = (bool)(this->mAbortByte == (U32)uVar8 & bVar12);
      local_38 = uVar8;
      if (bVar3) {
        iVar7 = 7;
        do {
          SimulationChannelDescriptor::Advance(uVar9);
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        this->mAbortByte = this->mAbortByte + 1;
      }
      else {
        iVar7 = 8;
        BitExtractor::BitExtractor(local_48,(ulong)puVar4[uVar8],LsbFirst,8);
        do {
          bitState = BitExtractor::GetNextBit();
          CreateSyncBit(this,bitState);
          cVar10 = cVar10 + '\x01';
          if (BVar11 != BIT_HIGH || bitState != BIT_HIGH) {
            cVar10 = '\0';
          }
          BVar11 = bitState;
          if (cVar10 == '\x04') {
            SimulationChannelDescriptor::Transition();
            BVar11 = BIT_LOW;
            SimulationChannelDescriptor::Advance(uVar9);
            cVar10 = '\0';
          }
          iVar7 = iVar7 + -1;
        } while (iVar7 != 0);
        BitExtractor::~BitExtractor(local_48);
        stream = local_40;
      }
      if (bVar3) {
        return;
      }
      uVar8 = (ulong)((int)local_38 + 1);
      puVar4 = (stream->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar8 < (ulong)((long)(stream->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar4));
  }
  CreateFlagBitSeq(this);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitBitSync( const vector<U8>& stream )
{
    // Opening flag
    CreateFlagBitSeq();

    bool abortFrame = ContainsElement( mFrameNumber );

    U8 consecutiveOnes = 0;
    BitState previousBit = BIT_LOW;
    // For each byte of the stream
    U32 index = 0;
    for( U32 s = 0; s < stream.size(); ++s )
    {
        bool abortThisByte = ( mAbortByte == s );
        if( abortFrame && abortThisByte )
        {
            // Sync bit abort sequence = 7 or more consecutive 1
            for( U32 j = 0; j < 7; ++j )
            {
                CreateSyncBit( BIT_HIGH );
            }
            mAbortByte++;
            return;
        }

        // For each bit of the byte stream
        BitExtractor bit_extractor( stream[ s ], AnalyzerEnums::LsbFirst, 8 );
        for( U32 i = 0; i < 8; ++i )
        {
            BitState bit = bit_extractor.GetNextBit();
            CreateSyncBit( bit );

            if( bit == BIT_HIGH )
            {
                if( previousBit == BIT_HIGH )
                {
                    consecutiveOnes++;
                }
                else
                {
                    consecutiveOnes = 0;
                }
            }
            else // bit low
            {
                consecutiveOnes = 0;
            }

            if( consecutiveOnes == 4 ) // if five 1s in a row, then insert a 0 and continue
            {
                CreateSyncBit( BIT_LOW );
                consecutiveOnes = 0;
                previousBit = BIT_LOW;
            }
            else
            {
                previousBit = bit;
            }
            index++;
        }
    }

    // Closing flag
    CreateFlagBitSeq();
}